

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

void __thiscall
QRenderRule::configurePalette(QRenderRule *this,QPalette *p,ColorGroup cg,QWidget *w,bool embedded)

{
  QSharedDataPointer<QStyleSheetBackgroundData> *this_00;
  QStyleSheetBorderData *pQVar1;
  bool bVar2;
  char cVar3;
  ColorRole CVar4;
  QStyleSheetBackgroundData *pQVar5;
  QStyleSheetPaletteData *pQVar6;
  ColorGroup CVar7;
  QSharedDataPointer<QStyleSheetPaletteData> *this_01;
  long in_FS_OFFSET;
  QBrush placeholder;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->bg;
  pQVar5 = QSharedDataPointer::operator_cast_to_QStyleSheetBackgroundData_
                     ((QSharedDataPointer *)this_00);
  CVar7 = (ColorGroup)p;
  if (pQVar5 != (QStyleSheetBackgroundData *)0x0) {
    pQVar5 = QSharedDataPointer<QStyleSheetBackgroundData>::operator->(this_00);
    if (*(int *)(*(long *)&pQVar5->brush + 4) != 0) {
      QSharedDataPointer<QStyleSheetBackgroundData>::operator->(this_00);
      QPalette::setBrush(CVar7,cg,(QBrush *)0x9);
      QSharedDataPointer<QStyleSheetBackgroundData>::operator->(this_00);
      QPalette::setBrush(CVar7,cg,(QBrush *)0x1);
      CVar4 = QWidget::backgroundRole(w);
      QSharedDataPointer<QStyleSheetBackgroundData>::operator->(this_00);
      QPalette::setBrush(CVar7,cg,(QBrush *)(ulong)CVar4);
      QSharedDataPointer<QStyleSheetBackgroundData>::operator->(this_00);
      QPalette::setBrush(CVar7,cg,(QBrush *)0xa);
    }
  }
  if (!embedded) goto LAB_003417d5;
  bVar2 = hasBackground(this);
  if (bVar2) {
    bVar2 = QStyleSheetBackgroundData::isTransparent((this_00->d).ptr);
    if (!bVar2) goto LAB_00341780;
  }
  else {
LAB_00341780:
    pQVar1 = (this->bd).d.ptr;
    if ((pQVar1 == (QStyleSheetBorderData *)0x0) ||
       ((pQVar1->bi).d.ptr == (QStyleSheetBorderImageData *)0x0)) goto LAB_003417d5;
    cVar3 = QPixmap::isNull();
    if (cVar3 != '\0') goto LAB_003417d5;
  }
  CVar4 = QWidget::backgroundRole(w);
  QBrush::QBrush((QBrush *)&local_48,NoBrush);
  QPalette::setBrush(CVar7,cg,(QBrush *)(ulong)CVar4);
  QBrush::~QBrush((QBrush *)&local_48);
LAB_003417d5:
  if ((this->pal).d.ptr != (QStyleSheetPaletteData *)0x0) {
    this_01 = &this->pal;
    pQVar6 = QSharedDataPointer<QStyleSheetPaletteData>::operator->(this_01);
    if (*(int *)(*(long *)&pQVar6->foreground + 4) != 0) {
      pQVar6 = QSharedDataPointer<QStyleSheetPaletteData>::operator->(this_01);
      setDefault(p,cg,ButtonText,&pQVar6->foreground,w);
      CVar4 = QWidget::foregroundRole(w);
      pQVar6 = QSharedDataPointer<QStyleSheetPaletteData>::operator->(this_01);
      setDefault(p,cg,CVar4,&pQVar6->foreground,w);
      pQVar6 = QSharedDataPointer<QStyleSheetPaletteData>::operator->(this_01);
      setDefault(p,cg,WindowText,&pQVar6->foreground,w);
      pQVar6 = QSharedDataPointer<QStyleSheetPaletteData>::operator->(this_01);
      setDefault(p,cg,Text,&pQVar6->foreground,w);
      pQVar6 = QSharedDataPointer<QStyleSheetPaletteData>::operator->(this_01);
      local_48 = *(undefined8 *)(*(long *)&pQVar6->foreground + 8);
      uStack_40 = *(undefined8 *)(*(long *)&pQVar6->foreground + 0x10);
      QColor::alpha();
      QColor::setAlpha((int)&local_48);
      _placeholder = &DAT_aaaaaaaaaaaaaaaa;
      pQVar6 = QSharedDataPointer<QStyleSheetPaletteData>::operator->(this_01);
      QBrush::QBrush(&placeholder,&pQVar6->foreground);
      QBrush::setColor((QColor *)&placeholder);
      setDefault(p,cg,PlaceholderText,&placeholder,w);
      QBrush::~QBrush(&placeholder);
    }
    pQVar6 = QSharedDataPointer<QStyleSheetPaletteData>::operator->(this_01);
    if (*(int *)(*(long *)&pQVar6->selectionBackground + 4) != 0) {
      QSharedDataPointer<QStyleSheetPaletteData>::operator->(this_01);
      QPalette::setBrush(CVar7,cg,(QBrush *)0xc);
    }
    pQVar6 = QSharedDataPointer<QStyleSheetPaletteData>::operator->(this_01);
    if (*(int *)(*(long *)&pQVar6->selectionForeground + 4) != 0) {
      QSharedDataPointer<QStyleSheetPaletteData>::operator->(this_01);
      QPalette::setBrush(CVar7,cg,(QBrush *)0xd);
    }
    pQVar6 = QSharedDataPointer<QStyleSheetPaletteData>::operator->(this_01);
    if (*(int *)(*(long *)&pQVar6->alternateBackground + 4) != 0) {
      QSharedDataPointer<QStyleSheetPaletteData>::operator->(this_01);
      QPalette::setBrush(CVar7,cg,(QBrush *)0x10);
    }
    pQVar6 = QSharedDataPointer<QStyleSheetPaletteData>::operator->(this_01);
    if (*(int *)(*(long *)&pQVar6->placeholderForeground + 4) != 0) {
      QSharedDataPointer<QStyleSheetPaletteData>::operator->(this_01);
      QPalette::setBrush(CVar7,cg,(QBrush *)0x14);
    }
    pQVar6 = QSharedDataPointer<QStyleSheetPaletteData>::operator->(this_01);
    if (*(int *)(*(long *)&pQVar6->accent + 4) != 0) {
      QSharedDataPointer<QStyleSheetPaletteData>::operator->(this_01);
      QPalette::setBrush(CVar7,cg,(QBrush *)0x15);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRenderRule::configurePalette(QPalette *p, QPalette::ColorGroup cg, const QWidget *w, bool embedded)
{
    if (bg && bg->brush.style() != Qt::NoBrush) {
        p->setBrush(cg, QPalette::Base, bg->brush); // for windows, windowxp
        p->setBrush(cg, QPalette::Button, bg->brush); // for plastique
        p->setBrush(cg, w->backgroundRole(), bg->brush);
        p->setBrush(cg, QPalette::Window, bg->brush);
    }

    if (embedded) {
        /* For embedded widgets (ComboBox, SpinBox and ScrollArea) we want the embedded widget
         * to be transparent when we have a transparent background or border image */
        if ((hasBackground() && background()->isTransparent())
            || (hasBorder() && border()->hasBorderImage() && !border()->borderImage()->pixmap.isNull()))
            p->setBrush(cg, w->backgroundRole(), Qt::NoBrush);
    }

    if (!hasPalette())
        return;

    if (pal->foreground.style() != Qt::NoBrush) {
        setDefault(p, cg, QPalette::ButtonText, pal->foreground, w);
        setDefault(p, cg, w->foregroundRole(), pal->foreground, w);
        setDefault(p, cg, QPalette::WindowText, pal->foreground, w);
        setDefault(p, cg, QPalette::Text, pal->foreground, w);
        QColor phColor(pal->foreground.color());
        phColor.setAlpha((phColor.alpha() + 1) / 2);
        QBrush placeholder = pal->foreground;
        placeholder.setColor(phColor);
        setDefault(p, cg, QPalette::PlaceholderText, placeholder, w);
    }
    if (pal->selectionBackground.style() != Qt::NoBrush)
        p->setBrush(cg, QPalette::Highlight, pal->selectionBackground);
    if (pal->selectionForeground.style() != Qt::NoBrush)
        p->setBrush(cg, QPalette::HighlightedText, pal->selectionForeground);
    if (pal->alternateBackground.style() != Qt::NoBrush)
        p->setBrush(cg, QPalette::AlternateBase, pal->alternateBackground);
    if (pal->placeholderForeground.style() != Qt::NoBrush)
        p->setBrush(cg, QPalette::PlaceholderText, pal->placeholderForeground);
    if (pal->accent.style() != Qt::NoBrush)
        p->setBrush(cg, QPalette::Accent, pal->accent);
}